

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O0

AggregateFunction *
duckdb::UDFWrapper::
CreateAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t>
          (string *name,LogicalType *ret_type,LogicalType *input_type)

{
  bool bVar1;
  runtime_error *prVar2;
  AggregateFunction *in_RDI;
  LogicalType *unaff_retaddr;
  string *in_stack_00000008;
  LogicalType *in_stack_ffffffffffffffd8;
  AggregateFunction *input_type_00;
  
  input_type_00 = in_RDI;
  bVar1 = TypesMatch<duckdb::dtime_t>(in_stack_ffffffffffffffd8);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"The return argument don\'t match!");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = TypesMatch<duckdb::dtime_t>(in_stack_ffffffffffffffd8);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"The input argument don\'t match!");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  CreateUnaryAggregateFunction<duckdb::UDFAverageFunction,duckdb::udf_avg_state_t<duckdb::dtime_t>,duckdb::dtime_t,duckdb::dtime_t>
            (in_stack_00000008,unaff_retaddr,(LogicalType *)input_type_00);
  return in_RDI;
}

Assistant:

inline static AggregateFunction CreateAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                        const LogicalType &input_type) {
		if (!TypesMatch<TR>(ret_type)) { // LCOV_EXCL_START
			throw std::runtime_error("The return argument don't match!");
		} // LCOV_EXCL_STOP

		if (!TypesMatch<TA>(input_type)) { // LCOV_EXCL_START
			throw std::runtime_error("The input argument don't match!");
		} // LCOV_EXCL_STOP

		return CreateUnaryAggregateFunction<UDF_OP, STATE, TR, TA>(name, ret_type, input_type);
	}